

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O1

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *gel)

{
  undefined4 uVar1;
  int iVar2;
  
  uVar1 = (**(code **)(*(long *)gel + 0xb8))();
  switch(uVar1) {
  case 0:
    iVar2 = 1;
    break;
  case 1:
    iVar2 = 3;
    break;
  case 2:
    iVar2 = 5;
    break;
  case 3:
    iVar2 = 9;
    break;
  case 4:
    iVar2 = 10;
    break;
  case 5:
    iVar2 = 0xe;
    break;
  case 6:
    iVar2 = 0xd;
    break;
  case 7:
    iVar2 = 0xc;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Element type not found on ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"static int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *)",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZVTKGeoMesh.cpp"
               ,0x540);
  }
  return iVar2;
}

Assistant:

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl * gel) {
    MElementType pzElType = gel->Type();

    int elType = -1;
    switch (pzElType) {
        case(EPoint):
        {
            elType = 1;
            break;
        }
        case(EOned):
        {
            elType = 3;
            break;
        }
        case (ETriangle):
        {
            elType = 5;
            break;
        }
        case (EQuadrilateral):
        {
            elType = 9;
            break;
        }
        case (ETetraedro):
        {
            elType = 10;
            break;
        }
        case (EPiramide):
        {
            elType = 14;
            break;
        }
        case (EPrisma):
        {
            elType = 13;
            break;
        }
        case (ECube):
        {
            elType = 12;
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
            break;
        }
    }
    if (elType == -1) {
        std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
        std::cout << "MIGHT BE CURVED ELEMENT (quadratic or quarter point)" << std::endl;
        DebugStop();
    }

    return elType;
}